

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O3

int lj_trace_flushall(lua_State *L)

{
  TValue *pTVar1;
  long lVar2;
  ptrdiff_t argbase;
  GCstr *pGVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  GCtrace *T;
  
  uVar5 = (ulong)(L->glref).ptr32;
  iVar4 = 1;
  if ((*(byte *)(uVar5 + 0x109) & 0x40) == 0) {
    if (1 < (ulong)*(uint *)(uVar5 + 0x3c4)) {
      lVar2 = *(long *)(uVar5 + 0x3b8);
      uVar6 = (ulong)*(uint *)(uVar5 + 0x3c4) + 1;
      do {
        T = (GCtrace *)(ulong)*(uint *)(lVar2 + -8 + uVar6 * 4);
        if (T != (GCtrace *)0x0) {
          if (T->root == 0) {
            trace_flushroot((jit_State *)(uVar5 + 0x248),T);
            lVar2 = *(long *)(uVar5 + 0x3b8);
          }
          T->traceno = 0;
          T->link = 0;
          *(undefined4 *)(lVar2 + -8 + uVar6 * 4) = 0;
        }
        uVar6 = uVar6 - 1;
      } while (2 < uVar6);
    }
    *(undefined2 *)(uVar5 + 0x298) = 0;
    *(undefined4 *)(uVar5 + 0x3c0) = 0;
    memset((void *)(uVar5 + 0x948),0,0x200);
    lj_mcode_free((jit_State *)(uVar5 + 0x248));
    *(undefined8 *)(uVar5 + 0x938) = 0;
    *(undefined8 *)(uVar5 + 0x940) = 0;
    *(undefined8 *)(uVar5 + 0x928) = 0;
    *(undefined8 *)(uVar5 + 0x930) = 0;
    *(undefined8 *)(uVar5 + 0x918) = 0;
    *(undefined8 *)(uVar5 + 0x920) = 0;
    *(undefined8 *)(uVar5 + 0x908) = 0;
    *(undefined8 *)(uVar5 + 0x910) = 0;
    *(undefined8 *)(uVar5 + 0x8f8) = 0;
    *(undefined8 *)(uVar5 + 0x900) = 0;
    *(undefined8 *)(uVar5 + 0x8e8) = 0;
    *(undefined8 *)(uVar5 + 0x8f0) = 0;
    *(undefined8 *)(uVar5 + 0x8d8) = 0;
    *(undefined8 *)(uVar5 + 0x8e0) = 0;
    *(undefined8 *)(uVar5 + 0x8c8) = 0;
    *(undefined8 *)(uVar5 + 0x8d0) = 0;
    iVar4 = 0;
    if ((*(byte *)((ulong)(L->glref).ptr32 + 0x10b) & 2) != 0) {
      argbase = lj_vmevent_prepare(L,LJ_VMEVENT_TRACE);
      if (argbase != 0) {
        pTVar1 = L->top;
        L->top = pTVar1 + 1;
        pGVar3 = lj_str_new(L,"flush",5);
        (pTVar1->u32).lo = (uint32_t)pGVar3;
        (pTVar1->field_2).it = 0xfffffffb;
        lj_vmevent_call(L,argbase);
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int lj_trace_flushall(lua_State *L)
{
  jit_State *J = L2J(L);
  ptrdiff_t i;
  if ((J2G(J)->hookmask & HOOK_GC))
    return 1;
  for (i = (ptrdiff_t)J->sizetrace-1; i > 0; i--) {
    GCtrace *T = traceref(J, i);
    if (T) {
      if (T->root == 0)
	trace_flushroot(J, T);
      lj_gdbjit_deltrace(J, T);
      T->traceno = T->link = 0;  /* Blacklist the link for cont_stitch. */
      setgcrefnull(J->trace[i]);
    }
  }
  J->cur.traceno = 0;
  J->freetrace = 0;
  /* Clear penalty cache. */
  memset(J->penalty, 0, sizeof(J->penalty));
  /* Free the whole machine code and invalidate all exit stub groups. */
  lj_mcode_free(J);
  memset(J->exitstubgroup, 0, sizeof(J->exitstubgroup));
  lj_vmevent_send(L, TRACE,
    setstrV(L, L->top++, lj_str_newlit(L, "flush"));
  );
  return 0;
}